

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

void __thiscall phpconvert::RegexHelper::test(RegexHelper *this,string *target,string *pattern)

{
  bool bVar1;
  size_type sVar2;
  ostream *os;
  const_reference pvVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  uint local_ec;
  uint i;
  match_flags local_d8;
  allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d1;
  match_flag_type flags;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  what;
  string local_60 [8];
  string file;
  const_iterator end;
  const_iterator start;
  regex expression;
  string *pattern_local;
  string *target_local;
  RegexHelper *this_local;
  
  boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)&start,
             pattern,0);
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(&end);
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&file.field_2 + 8));
  std::__cxx11::string::string(local_60,(string *)target);
  end._M_current = (char *)std::__cxx11::string::begin();
  what._72_8_ = std::__cxx11::string::end();
  file.field_2._8_8_ = what._72_8_;
  std::
  allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(&local_d1);
  boost::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&flags,&local_d1);
  std::
  allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator(&local_d1);
  local_d8 = format_default;
  while( true ) {
    bVar1 = boost::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )end._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )file.field_2._8_8_,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&flags,
                       (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                        *)&start,local_d8);
    if (!bVar1) break;
    local_ec = 0;
    while( true ) {
      sVar2 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&flags);
      if (sVar2 <= local_ec) break;
      os = std::operator<<((ostream *)&std::cout,"[");
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&flags,local_ec);
      pbVar4 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)os,pvVar3);
      std::operator<<((ostream *)pbVar4,"] ");
      local_ec = local_ec + 1;
    }
    pvVar3 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&flags,0);
    end._M_current =
         (pvVar3->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).second._M_current;
    boost::regex_constants::operator|=(&local_d8,match_prev_avail);
    boost::regex_constants::operator|=(&local_d8,match_not_bob);
  }
  boost::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&flags);
  std::__cxx11::string::~string(local_60);
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::~basic_regex
            ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)&start
            );
  return;
}

Assistant:

void RegexHelper::test(string target, string pattern) {
	boost::regex expression(pattern);
	std::string::const_iterator start, end;
	const string file = target;
	start = file.begin();
	end = file.end();
	boost::match_results<std::string::const_iterator> what;
	boost::match_flag_type flags = boost::match_default;
	while (boost::regex_search(start, end, what, expression, flags)) {
		for (unsigned i = 0; i < what.size(); ++i) {
			std::cout << "[" << what[i] << "] ";
		}
		// update search position:
		start = what[0].second;
		// update flags:
		flags |= boost::match_prev_avail;
		flags |= boost::match_not_bob;
	}
}